

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtConvexConcaveCollisionAlgorithm.cpp
# Opt level: O2

cbtScalar __thiscall
cbtConvexConcaveCollisionAlgorithm::calculateTimeOfImpact
          (cbtConvexConcaveCollisionAlgorithm *this,cbtCollisionObject *body0,
          cbtCollisionObject *body1,cbtDispatcherInfo *dispatchInfo,cbtManifoldResult *resultOut)

{
  bool bVar1;
  undefined1 auVar2 [16];
  float fVar3;
  cbtCollisionObject *pcVar4;
  cbtScalar cVar5;
  undefined1 auVar6 [16];
  undefined1 in_ZMM0 [64];
  undefined1 auVar8 [56];
  undefined1 auVar7 [64];
  undefined1 in_ZMM1 [64];
  undefined1 auVar10 [56];
  undefined1 auVar9 [64];
  undefined1 auVar11 [16];
  cbtVector3 cVar12;
  cbtVector3 rayAabbMin;
  cbtTransform convexToLocal;
  cbtTransform convexFromLocal;
  cbtTransform triInv;
  cbtScalar cStack_1f0;
  cbtTransform local_1c0;
  cbtTransform local_180;
  cbtVector3 local_140;
  cbtScalar acStack_130 [2];
  cbtScalar local_128 [2];
  cbtScalar acStack_120 [2];
  cbtScalar acStack_118 [2];
  cbtScalar acStack_110 [2];
  ulong local_108;
  cbtScalar acStack_100 [2];
  cbtScalar local_f8 [2];
  cbtScalar acStack_f0 [2];
  cbtScalar local_e8 [2];
  cbtScalar acStack_e0 [2];
  cbtScalar local_d8 [2];
  cbtScalar acStack_d0 [22];
  float local_78;
  float local_74;
  cbtTransform local_70;
  
  auVar10 = in_ZMM1._8_56_;
  auVar8 = in_ZMM0._8_56_;
  bVar1 = this->m_isSwapped;
  pcVar4 = body0;
  if (bVar1 != false) {
    pcVar4 = body1;
  }
  cVar12 = ::operator-(&(pcVar4->m_interpolationWorldTransform).m_origin,
                       &(pcVar4->m_worldTransform).m_origin);
  auVar9._0_8_ = cVar12.m_floats._8_8_;
  auVar9._8_56_ = auVar10;
  auVar7._0_8_ = cVar12.m_floats._0_8_;
  auVar7._8_56_ = auVar8;
  local_140.m_floats = (cbtScalar  [4])vmovlhps_avx(auVar7._0_16_,auVar9._0_16_);
  cVar5 = cbtVector3::length2(&local_140);
  if (pcVar4->m_ccdMotionThreshold * pcVar4->m_ccdMotionThreshold <= cVar5) {
    if (bVar1 != false) {
      body1 = body0;
    }
    cbtTransform::inverse(&local_70,&body1->m_worldTransform);
    cbtTransform::operator*(&local_180,&local_70,&pcVar4->m_worldTransform);
    cbtTransform::operator*(&local_1c0,&local_70,&pcVar4->m_interpolationWorldTransform);
    if (10 < body1->m_collisionShape->m_shapeType - 0x19U) {
      return 1.0;
    }
    cStack_1f0 = local_180.m_origin.m_floats[2];
    auVar2 = vinsertps_avx(ZEXT416((uint)local_1c0.m_origin.m_floats[0]),
                           ZEXT416((uint)local_1c0.m_origin.m_floats[1]),0x10);
    auVar11._8_8_ = 0;
    auVar11._0_4_ = local_180.m_origin.m_floats[0];
    auVar11._4_4_ = local_180.m_origin.m_floats[1];
    auVar2 = vmaxps_avx(auVar2,auVar11);
    vmaxss_avx(ZEXT416((uint)local_1c0.m_origin.m_floats[2]),ZEXT416((uint)cStack_1f0));
    local_78 = pcVar4->m_ccdSweptSphereRadius;
    auVar6._0_4_ = local_78 + auVar2._0_4_;
    auVar6._4_4_ = local_78 + auVar2._4_4_;
    auVar6._8_4_ = local_78 + auVar2._8_4_;
    auVar6._12_4_ = local_78 + auVar2._12_4_;
    vmovlps_avx(auVar6);
    local_140.m_floats[2] = local_180.m_basis.m_el[0].m_floats[0];
    local_140.m_floats[3] = local_180.m_basis.m_el[0].m_floats[1];
    local_140.m_floats._0_8_ = &PTR__cbtTriangleCallback_011945c0;
    acStack_130[0] = local_180.m_basis.m_el[0].m_floats[2];
    acStack_130[1] = local_180.m_basis.m_el[0].m_floats[3];
    local_128[0] = local_180.m_basis.m_el[1].m_floats[0];
    local_128[1] = local_180.m_basis.m_el[1].m_floats[1];
    acStack_120[0] = local_180.m_basis.m_el[1].m_floats[2];
    acStack_120[1] = local_180.m_basis.m_el[1].m_floats[3];
    acStack_118[0] = local_180.m_basis.m_el[2].m_floats[0];
    acStack_118[1] = local_180.m_basis.m_el[2].m_floats[1];
    acStack_110[0] = local_180.m_basis.m_el[2].m_floats[2];
    acStack_110[1] = local_180.m_basis.m_el[2].m_floats[3];
    local_108._0_4_ = local_180.m_origin.m_floats[0];
    local_108._4_4_ = local_180.m_origin.m_floats[1];
    acStack_100[0] = local_180.m_origin.m_floats[2];
    acStack_100[1] = local_180.m_origin.m_floats[3];
    local_f8[0] = local_1c0.m_basis.m_el[0].m_floats[0];
    local_f8[1] = local_1c0.m_basis.m_el[0].m_floats[1];
    acStack_f0[0] = local_1c0.m_basis.m_el[0].m_floats[2];
    acStack_f0[1] = local_1c0.m_basis.m_el[0].m_floats[3];
    local_e8[0] = local_1c0.m_basis.m_el[1].m_floats[0];
    local_e8[1] = local_1c0.m_basis.m_el[1].m_floats[1];
    acStack_e0[0] = local_1c0.m_basis.m_el[1].m_floats[2];
    acStack_e0[1] = local_1c0.m_basis.m_el[1].m_floats[3];
    local_d8[0] = local_1c0.m_basis.m_el[2].m_floats[0];
    local_d8[1] = local_1c0.m_basis.m_el[2].m_floats[1];
    acStack_d0[0] = local_1c0.m_basis.m_el[2].m_floats[2];
    acStack_d0[1] = local_1c0.m_basis.m_el[2].m_floats[3];
    local_74 = pcVar4->m_hitFraction;
    (*body1->m_collisionShape->_vptr_cbtCollisionShape[0x10])();
    fVar3 = local_74;
    if (local_74 < pcVar4->m_hitFraction) {
      pcVar4->m_hitFraction = local_74;
      cbtTriangleCallback::~cbtTriangleCallback((cbtTriangleCallback *)&local_140);
      return fVar3;
    }
    cbtTriangleCallback::~cbtTriangleCallback((cbtTriangleCallback *)&local_140);
  }
  return 1.0;
}

Assistant:

cbtScalar cbtConvexConcaveCollisionAlgorithm::calculateTimeOfImpact(cbtCollisionObject* body0, cbtCollisionObject* body1, const cbtDispatcherInfo& dispatchInfo, cbtManifoldResult* resultOut)
{
	(void)resultOut;
	(void)dispatchInfo;
	cbtCollisionObject* convexbody = m_isSwapped ? body1 : body0;
	cbtCollisionObject* triBody = m_isSwapped ? body0 : body1;

	//quick approximation using raycast, todo: hook up to the continuous collision detection (one of the cbtConvexCast)

	//only perform CCD above a certain threshold, this prevents blocking on the long run
	//because object in a blocked ccd state (hitfraction<1) get their linear velocity halved each frame...
	cbtScalar squareMot0 = (convexbody->getInterpolationWorldTransform().getOrigin() - convexbody->getWorldTransform().getOrigin()).length2();
	if (squareMot0 < convexbody->getCcdSquareMotionThreshold())
	{
		return cbtScalar(1.);
	}

	//const cbtVector3& from = convexbody->m_worldTransform.getOrigin();
	//cbtVector3 to = convexbody->m_interpolationWorldTransform.getOrigin();
	//todo: only do if the motion exceeds the 'radius'

	cbtTransform triInv = triBody->getWorldTransform().inverse();
	cbtTransform convexFromLocal = triInv * convexbody->getWorldTransform();
	cbtTransform convexToLocal = triInv * convexbody->getInterpolationWorldTransform();

	struct LocalTriangleSphereCastCallback : public cbtTriangleCallback
	{
		cbtTransform m_ccdSphereFromTrans;
		cbtTransform m_ccdSphereToTrans;
		cbtTransform m_meshTransform;

		cbtScalar m_ccdSphereRadius;
		cbtScalar m_hitFraction;

		LocalTriangleSphereCastCallback(const cbtTransform& from, const cbtTransform& to, cbtScalar ccdSphereRadius, cbtScalar hitFraction)
			: m_ccdSphereFromTrans(from),
			  m_ccdSphereToTrans(to),
			  m_ccdSphereRadius(ccdSphereRadius),
			  m_hitFraction(hitFraction)
		{
		}

		virtual void processTriangle(cbtVector3* triangle, int partId, int triangleIndex)
		{
			BT_PROFILE("processTriangle");
			(void)partId;
			(void)triangleIndex;
			//do a swept sphere for now
			cbtTransform ident;
			ident.setIdentity();
			cbtConvexCast::CastResult castResult;
			castResult.m_fraction = m_hitFraction;
			cbtSphereShape pointShape(m_ccdSphereRadius);
			cbtTriangleShape triShape(triangle[0], triangle[1], triangle[2]);
			cbtVoronoiSimplexSolver simplexSolver;
			cbtSubsimplexConvexCast convexCaster(&pointShape, &triShape, &simplexSolver);
			//GjkConvexCast	convexCaster(&pointShape,convexShape,&simplexSolver);
			//ContinuousConvexCollision convexCaster(&pointShape,convexShape,&simplexSolver,0);
			//local space?

			if (convexCaster.calcTimeOfImpact(m_ccdSphereFromTrans, m_ccdSphereToTrans,
											  ident, ident, castResult))
			{
				if (m_hitFraction > castResult.m_fraction)
					m_hitFraction = castResult.m_fraction;
			}
		}
	};

	if (triBody->getCollisionShape()->isConcave())
	{
		cbtVector3 rayAabbMin = convexFromLocal.getOrigin();
		rayAabbMin.setMin(convexToLocal.getOrigin());
		cbtVector3 rayAabbMax = convexFromLocal.getOrigin();
		rayAabbMax.setMax(convexToLocal.getOrigin());
		cbtScalar ccdRadius0 = convexbody->getCcdSweptSphereRadius();
		rayAabbMin -= cbtVector3(ccdRadius0, ccdRadius0, ccdRadius0);
		rayAabbMax += cbtVector3(ccdRadius0, ccdRadius0, ccdRadius0);

		cbtScalar curHitFraction = cbtScalar(1.);  //is this available?
		LocalTriangleSphereCastCallback raycastCallback(convexFromLocal, convexToLocal,
														convexbody->getCcdSweptSphereRadius(), curHitFraction);

		raycastCallback.m_hitFraction = convexbody->getHitFraction();

		cbtCollisionObject* concavebody = triBody;

		cbtConcaveShape* triangleMesh = (cbtConcaveShape*)concavebody->getCollisionShape();

		if (triangleMesh)
		{
			triangleMesh->processAllTriangles(&raycastCallback, rayAabbMin, rayAabbMax);
		}

		if (raycastCallback.m_hitFraction < convexbody->getHitFraction())
		{
			convexbody->setHitFraction(raycastCallback.m_hitFraction);
			return raycastCallback.m_hitFraction;
		}
	}

	return cbtScalar(1.);
}